

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Branch *b)

{
  CodePrinter *this_00;
  size_t sVar1;
  Block *b_00;
  string_view text;
  string_view text_00;
  string local_40;
  
  this_00 = this->out;
  text._M_str = "branch ";
  text._M_len = 7;
  choc::text::CodePrinter::writeBlock(this_00,text);
  getBlockName_abi_cxx11_(&local_40,(PrinterStream *)(b->target).object,b_00);
  text_00._M_str = local_40._M_dataplus._M_p;
  text_00._M_len = local_40._M_string_length;
  choc::text::CodePrinter::writeBlock(this_00,text_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  sVar1 = (b->targetArgs).numActive;
  if (sVar1 != 0) {
    local_40._M_dataplus._M_p = (pointer)(b->targetArgs).items;
    local_40._M_string_length = (long)local_40._M_dataplus._M_p + sVar1 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
  }
  return;
}

Assistant:

void printDescription (const heart::Branch& b)
        {
            out << "branch " << getBlockName (b.target);

            if (! b.targetArgs.empty())
                printArgList (b.targetArgs);
        }